

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleFunctionalTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::MultisampleTextureFunctionalTestsTextureSizeVertexShadersTest::iterate
          (MultisampleTextureFunctionalTestsTextureSizeVertexShadersTest *this)

{
  ostringstream *poVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  GLuint GVar6;
  undefined4 extraout_var;
  float *pfVar8;
  TestError *this_00;
  byte bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  GLint link_status;
  GLint compile_status;
  char *varying_name;
  int local_1c0;
  int local_1bc;
  char *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar7;
  
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_OES_texture_storage_multisample_2d_array");
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar7 + 0x700))(1,&this->tfo_id);
  (**(code **)(lVar7 + 0xd0))(0x8e22,this->tfo_id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Could not set up a transform feedback object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xadc);
  (**(code **)(lVar7 + 0x6c8))(1,&this->bo_id);
  (**(code **)(lVar7 + 0x40))(0x8c8e,this->bo_id);
  (**(code **)(lVar7 + 0x150))(0x8c8e,4,0,0x88e5);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Could not set up a buffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xae3);
  if (bVar3) {
    (**(code **)(lVar7 + 0x6f8))(1,&this->to_2d_multisample_array_id);
    (**(code **)(lVar7 + 0x6f8))(1,&this->to_2d_multisample_id);
    (**(code **)(lVar7 + 0xb8))(0x9102,this->to_2d_multisample_array_id);
  }
  else {
    (**(code **)(lVar7 + 0x6f8))(1,&this->to_2d_multisample_id);
  }
  (**(code **)(lVar7 + 0xb8))(0x9100,this->to_2d_multisample_id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Could not set up texture objects",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xaf8);
  (**(code **)(lVar7 + 0x1390))(0x9100,2,0x8058,0x10,0x20,1);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,
                  "glTexStorage2DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE texture target"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xaff);
  if (bVar3) {
    (**(code **)(lVar7 + 0x13a8))(0x9102,2,0x8058,0x10,0x20,8,1);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,
                    "gltexStorage3DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                    ,0xb0a);
  }
  local_1bc = 0;
  GVar6 = (**(code **)(lVar7 + 0x3f0))(0x8b30);
  this->fs_id = GVar6;
  (**(code **)(lVar7 + 0x12b8))(GVar6,1,&iterate::fs_body,0);
  (**(code **)(lVar7 + 0x248))(this->fs_id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Could not set up a fragment shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xb19);
  (**(code **)(lVar7 + 0xa70))(this->fs_id,0x8b81,&local_1bc);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Could not query fragment shader\'s compile status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xb1c);
  if (local_1bc == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not compile fragment shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
               ,0xb20);
  }
  else {
    GVar6 = (**(code **)(lVar7 + 0x3f0))(0x8b31);
    this->vs_2d_id = GVar6;
    (**(code **)(lVar7 + 0x12b8))(GVar6,1,&iterate::vs_2d_body,0);
    (**(code **)(lVar7 + 0x248))(this->vs_2d_id);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Could not set up a vertex shader for 2D multisample texture case",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                    ,0xb3d);
    (**(code **)(lVar7 + 0xa70))(this->vs_2d_id,0x8b81,&local_1bc);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Could not query 2D multisample texture vertex shader\'s compile status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                    ,0xb40);
    if (local_1bc != 0) {
      if (bVar3) {
        GVar6 = (**(code **)(lVar7 + 0x3f0))(0x8b31);
        this->vs_2d_array_id = GVar6;
        (**(code **)(lVar7 + 0x12b8))(GVar6,1,&iterate::vs_2d_array_body,0);
        (**(code **)(lVar7 + 0x248))(this->vs_2d_array_id);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,
                        "Could not set up a vertex shader for 2D multisample array texture case",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0xb64);
        (**(code **)(lVar7 + 0xa70))(this->vs_2d_array_id,0x8b81,&local_1bc);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,
                        "Could not query 2D multisample array texture vertex shader\'s compile status"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0xb68);
        if (local_1bc == 0) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Could not compile vertex shader for 2D multisample array texture",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                     ,0xb6c);
          goto LAB_00c924cc;
        }
      }
      iVar4 = 0;
      bVar9 = 1;
      do {
        if (!bVar3 && bVar9 == 0) break;
        if (this->po_id != 0) {
          (**(code **)(lVar7 + 0x448))();
          this->po_id = 0;
        }
        GVar6 = (**(code **)(lVar7 + 0x3c8))();
        this->po_id = GVar6;
        (**(code **)(lVar7 + 0x10))(GVar6,this->fs_id);
        (**(code **)(lVar7 + 0x10))(this->po_id,(&this->vs_2d_array_id)[bVar9]);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glAttachShader() call(s) failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0xba0);
        local_1b8 = "is_size_correct";
        (**(code **)(lVar7 + 0x14c8))(this->po_id,1,&local_1b8,0x8c8c);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glTransformFeedbackVaryings() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0xba6);
        local_1c0 = 0;
        (**(code **)(lVar7 + 0xce8))(this->po_id);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glLinkProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0xbac);
        (**(code **)(lVar7 + 0x9d8))(this->po_id,0x8b82,&local_1c0);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glGetProgramiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0xbaf);
        if (local_1c0 != 1) {
          local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"Linking failed for program object in iteration ",0x2f);
          std::ostream::operator<<(poVar1,iVar4);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Program object linking failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                     ,0xbb6);
          goto LAB_00c924cc;
        }
        (**(code **)(lVar7 + 0x48))(0x8c8e,0,this->bo_id);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glBindBufferBase() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0xbbb);
        (**(code **)(lVar7 + 0x1680))(this->po_id);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glUseProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0xbbe);
        (**(code **)(lVar7 + 0x30))(0);
        (**(code **)(lVar7 + 0x538))(0,0,1);
        (**(code **)(lVar7 + 0x638))();
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"Rendering failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0xbc6);
        pfVar8 = (float *)(**(code **)(lVar7 + 0xd00))(0x8c8e,0,4,3);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glMapBufferRange() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0xbd1);
        fVar2 = *pfVar8;
        *pfVar8 = 0.0;
        (**(code **)(lVar7 + 0x1670))(0x8c8e);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glUnmapBuffer() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0xbd7);
        fVar11 = fVar2 + -1.0;
        fVar12 = -fVar11;
        if (-fVar11 <= fVar11) {
          fVar12 = fVar11;
        }
        if (1e-05 < fVar12) {
          local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"Retrieved value: ",0x11);
          std::ostream::_M_insert<double>((double)fVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,", expected: 1.0",0xf);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Invalid value reported.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                     ,0xbde);
          goto LAB_00c924cc;
        }
        iVar4 = 1;
        bVar10 = bVar9 != 0;
        bVar9 = 0;
      } while (bVar10);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not compile vertex shader for 2D multisample texture",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
               ,0xb44);
  }
LAB_00c924cc:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureFunctionalTestsTextureSizeVertexShadersTest::iterate()
{
	bool are_multisample_2d_array_tos_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up a TFO */
	gl.genTransformFeedbacks(1, &tfo_id);
	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, tfo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a transform feedback object");

	/* Set up a buffer object */
	gl.genBuffers(1, &bo_id);
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, bo_id);
	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, sizeof(float), NULL, GL_STATIC_READ);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a buffer object");

	/* Set up texture objects */
	if (are_multisample_2d_array_tos_supported)
	{
		gl.genTextures(1, &to_2d_multisample_array_id);
	}

	gl.genTextures(1, &to_2d_multisample_id);

	/* NOTE: Since we're binding the textures to zero texture unit,
	 *       we don't need to do glUniform1i() calls to configure
	 *       the texture samplers in the vertex shaders later on.
	 */
	if (are_multisample_2d_array_tos_supported)
	{
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_2d_multisample_array_id);
	}

	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_2d_multisample_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up texture objects");

	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2, /* samples */
							   GL_RGBA8, 16,				 /* width */
							   32,							 /* height */
							   GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(),
						"glTexStorage2DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE texture target");

	if (are_multisample_2d_array_tos_supported)
	{
		gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, /* samples */
								   GL_RGBA8, 16,						   /* width */
								   32,									   /* height */
								   8,									   /* depth */
								   GL_TRUE);							   /* fixedsamplelocations */
		GLU_EXPECT_NO_ERROR(
			gl.getError(),
			"gltexStorage3DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target");
	}

	/* Set up a fragment shader */
	glw::GLint		   compile_status = GL_FALSE;
	static const char* fs_body		  = "#version 310 es\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "}\n";

	fs_id = gl.createShader(GL_FRAGMENT_SHADER);

	gl.shaderSource(fs_id, 1 /* count */, &fs_body, NULL);
	gl.compileShader(fs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a fragment shader");

	gl.getShaderiv(fs_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query fragment shader's compile status");

	if (compile_status == GL_FALSE)
	{
		TCU_FAIL("Could not compile fragment shader");
	}

	/* Set up a vertex shader for 2D multisample texture case */
	static const char* vs_2d_body = "#version 310 es\n"
									"\n"
									"precision highp float;\n"
									"\n"
									"uniform highp sampler2DMS sampler;\n"
									"out           float       is_size_correct;\n"
									"\n"
									"void main()\n"
									"{\n"
									"    ivec2 size = textureSize(sampler);\n"
									"\n"
									"    if (size.x == 16 && size.y == 32)\n"
									"    {\n"
									"        is_size_correct = 1.0f;\n"
									"    }\n"
									"    else\n"
									"    {\n"
									"        is_size_correct = 0.0f;\n"
									"    }\n"
									"}\n";

	vs_2d_id = gl.createShader(GL_VERTEX_SHADER);

	gl.shaderSource(vs_2d_id, 1 /* count */, &vs_2d_body, NULL);
	gl.compileShader(vs_2d_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a vertex shader for 2D multisample texture case");

	gl.getShaderiv(vs_2d_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query 2D multisample texture vertex shader's compile status");

	if (compile_status == GL_FALSE)
	{
		TCU_FAIL("Could not compile vertex shader for 2D multisample texture");
	}

	/* Set up a vertex shader for 2D multisample array texture case */
	if (are_multisample_2d_array_tos_supported)
	{
		static const char* vs_2d_array_body = "#version 310 es\n"
											  "\n"
											  "#extension GL_OES_texture_storage_multisample_2d_array : enable\n"
											  "precision highp float;\n"
											  "\n"
											  "uniform highp sampler2DMSArray sampler;\n"
											  "out           float            is_size_correct;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "    ivec3 size = textureSize(sampler);\n"
											  "\n"
											  "    if (size.x == 16 && size.y == 32 && size.z == 8)\n"
											  "    {\n"
											  "        is_size_correct = 1.0f;\n"
											  "    }\n"
											  "    else\n"
											  "    {\n"
											  "        is_size_correct = 0.0f;\n"
											  "    }\n"
											  "}\n";

		vs_2d_array_id = gl.createShader(GL_VERTEX_SHADER);

		gl.shaderSource(vs_2d_array_id, 1 /* count */, &vs_2d_array_body, NULL);
		gl.compileShader(vs_2d_array_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a vertex shader for 2D multisample array texture case");

		gl.getShaderiv(vs_2d_array_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(),
							"Could not query 2D multisample array texture vertex shader's compile status");

		if (compile_status == GL_FALSE)
		{
			TCU_FAIL("Could not compile vertex shader for 2D multisample array texture");
		}
	}

	/* Execute two iterations:
	 *
	 * a) Create a program object using fs and vs_2d shaders;
	 * b) Create a program object using fs and vs_2d_array shaders.
	 *
	 * Case b) should only be executed if 2D Array MS textures are
	 * supported.
	 */
	for (int n_iteration = 0; n_iteration < 2 /* iterations */; ++n_iteration)
	{
		if (n_iteration == 1 && !are_multisample_2d_array_tos_supported)
		{
			/* Skip the iteration */
			continue;
		}

		if (po_id != 0)
		{
			gl.deleteProgram(po_id);

			po_id = 0;
		}

		po_id = gl.createProgram();

		/* Attach iteration-specific shaders */
		switch (n_iteration)
		{
		case 0:
		{
			gl.attachShader(po_id, fs_id);
			gl.attachShader(po_id, vs_2d_id);

			break;
		}

		case 1:
		{
			gl.attachShader(po_id, fs_id);
			gl.attachShader(po_id, vs_2d_array_id);

			break;
		}

		default:
			TCU_FAIL("Unrecognized iteration index");
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

		/* Configure the program object for XFB */
		const char* varying_name = "is_size_correct";

		gl.transformFeedbackVaryings(po_id, 1 /* count */, &varying_name, GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

		/* Link the program object */
		glw::GLint link_status = GL_FALSE;

		gl.linkProgram(po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

		gl.getProgramiv(po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

		if (link_status != GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Linking failed for program object in iteration "
							   << n_iteration << tcu::TestLog::EndMessage;

			TCU_FAIL("Program object linking failed");
		}

		/* Render a point using the program */
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, bo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");

		gl.useProgram(po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

		gl.beginTransformFeedback(GL_POINTS);
		{
			gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
		}
		gl.endTransformFeedback();

		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed");

		/* Read the captured data. Reset the contents of the BO before the buffer
		 * object is unmapped.
		 */
		void*		data_ptr = NULL;
		const float epsilon  = (float)1e-5;
		float		result   = 0.0f;

		data_ptr = gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* offset */, sizeof(float) /* size */,
									 GL_MAP_READ_BIT | GL_MAP_WRITE_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed");

		result = *((const float*)data_ptr);
		memset(data_ptr, 0, sizeof(float));

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed");

		if (de::abs(result - 1.0f) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Retrieved value: " << result << ", expected: 1.0"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported.");
		}
	}

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}